

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result wabt::ReadBinaryIr(char *filename,void *data,size_t size,ReadBinaryOptions *options,
                         Errors *errors,Module *out_module)

{
  Result RVar1;
  BinaryReaderIR reader;
  BinaryReaderDelegate local_68;
  Errors *local_58;
  Module *local_50;
  undefined8 local_48;
  void *pvStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  char *local_20;
  
  local_68.state = (State *)0x0;
  local_68._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderIR_00181bc0;
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_58 = errors;
  local_50 = out_module;
  local_20 = filename;
  RVar1 = ReadBinary(data,size,&local_68,options);
  local_68._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderIR_00181bc0;
  if (pvStack_40 != (void *)0x0) {
    operator_delete(pvStack_40);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryIr(const char* filename,
                    const void* data,
                    size_t size,
                    const ReadBinaryOptions& options,
                    Errors* errors,
                    Module* out_module) {
  BinaryReaderIR reader(out_module, filename, errors);
  return ReadBinary(data, size, &reader, options);
}